

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

void rr::pa::TriangleFan::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
               (__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  reference pTVar1;
  __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
  local_60;
  Triangle local_58;
  long local_38;
  size_t ndx;
  VertexPacket *first;
  int provokingOffset;
  ProvokingVertex provokingConvention_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
  outputIterator_local;
  
  if (numVertices != 0) {
    first._0_4_ = 2;
    if (provokingConvention == PROVOKINGVERTEX_FIRST) {
      first._0_4_ = 1;
    }
    ndx = (size_t)*vertices;
    local_38 = 1;
    first._4_4_ = provokingConvention;
    _provokingOffset = numVertices;
    numVertices_local = (size_t)vertices;
    vertices_local = &(outputIterator._M_current)->v0;
    for (; local_38 + 1U < _provokingOffset; local_38 = local_38 + 1) {
      Triangle::Triangle(&local_58,(VertexPacket *)ndx,
                         *(VertexPacket **)(numVertices_local + local_38 * 8),
                         *(VertexPacket **)(numVertices_local + 8 + local_38 * 8),(int)first);
      local_60 = __gnu_cxx::
                 __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                 ::operator++((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                               *)&vertices_local,0);
      pTVar1 = __gnu_cxx::
               __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
               ::operator*(&local_60);
      pTVar1->v0 = local_58.v0;
      pTVar1->v1 = local_58.v1;
      pTVar1->v2 = local_58.v2;
      pTVar1->provokingIndex = local_58.provokingIndex;
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices == 0)
		{
		}
		else
		{
			const int			provokingOffset	= (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (1) : (2);
			VertexPacket* const	first			= vertices[0];

			for (size_t ndx = 1; ndx + 1 < numVertices; ++ndx)
				*(outputIterator++) = Triangle(first, vertices[ndx], vertices[ndx+1], provokingOffset);
		}
	}